

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int __thiscall
CVmObjDate::getp_getJulianDay(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  double d;
  bignum_t<32> b;
  int iVar1;
  vm_obj_id_t vVar2;
  undefined4 in_register_00000034;
  long lVar3;
  caldate_t cd;
  bignum_t<32> local_68;
  bignum_t<32> jt;
  bignum_t<32> jday;
  
  if (oargc == (uint *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)(int)*oargc;
  }
  if (getp_getJulianDay(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_getJulianDay(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_getJulianDay::desc.min_argc_ = 0;
      getp_getJulianDay::desc.opt_argc_ = 0;
      getp_getJulianDay::desc.varargs_ = 0;
      __cxa_guard_release(&getp_getJulianDay(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getJulianDay::desc);
  if (iVar1 == 0) {
    caldate_t::set_dayno(&cd,*(int32_t *)(this->super_CVmObject).ext_);
    d = caldate_t::julian_dayno(&cd);
    bignum_t<32>::bignum_t(&jday,d);
    bignum_t<32>::bignum_t(&jt,(long)*(int *)((this->super_CVmObject).ext_ + 4));
    bignum_t<32>::operator/(&local_68,&jt,86400000);
    b.ext[8] = local_68.ext[8];
    b.ext[9] = local_68.ext[9];
    b.ext[10] = local_68.ext[10];
    b.ext[0xb] = local_68.ext[0xb];
    b.ext[0xc] = local_68.ext[0xc];
    b.ext[0] = local_68.ext[0];
    b.ext[1] = local_68.ext[1];
    b.ext[2] = local_68.ext[2];
    b.ext[3] = local_68.ext[3];
    b.ext[4] = local_68.ext[4];
    b.ext[5] = local_68.ext[5];
    b.ext[6] = local_68.ext[6];
    b.ext[7] = local_68.ext[7];
    b.ext[0xd] = local_68.ext[0xd];
    b.ext[0xe] = local_68.ext[0xe];
    b.ext[0xf] = local_68.ext[0xf];
    b.ext[0x10] = local_68.ext[0x10];
    b.ext[0x11] = local_68.ext[0x11];
    b.ext[0x12] = local_68.ext[0x12];
    b.ext[0x13] = local_68.ext[0x13];
    b.ext[0x14] = local_68.ext[0x14];
    bignum_t<32>::operator+=(&jday,b);
    vVar2 = CVmObjBigNum::create<32>(0,&jday);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar2;
    sp_ = sp_ + -lVar3;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getJulianDay(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the Julian day number for midnight UTC on my day number */
    caldate_t cd(get_ext()->dayno);
    bignum_t<32> jday(cd.julian_dayno());

    /* add my fraction of a day past midnight UTC */
    bignum_t<32> jt((long)get_ext()->daytime);
    jday += jt / (long)(24*60*60*1000);

    /* return a BigNumber result */
    retval->set_obj(CVmObjBigNum::create(vmg_ FALSE, &jday));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}